

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O1

int ipc_helper_tcp_connection(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  uint uVar3;
  int extraout_EAX_00;
  tcp_conn *ptVar4;
  uv_loop_t *puVar5;
  undefined8 uVar6;
  void *pvVar7;
  undefined8 *extraout_RDX;
  uv_pipe_t *unaff_RBX;
  uv_pipe_t *puVar8;
  uv_loop_t *puVar9;
  uv_pipe_t *puVar10;
  char *pcVar11;
  uv_tcp_t *puVar12;
  uv_write_t *puVar13;
  ulong uVar14;
  sockaddr_in addr;
  undefined1 auStack_c0 [16];
  uv_pipe_t *puStack_b0;
  undefined1 auStack_a8 [16];
  undefined1 auStack_98 [16];
  uv_pipe_t *puStack_88;
  undefined1 auStack_78 [8];
  code *pcStack_70;
  uv_pipe_t *puStack_68;
  undefined1 auStack_30 [16];
  uv_pipe_t *puStack_20;
  undefined1 auStack_18 [16];
  
  puStack_20 = (uv_pipe_t *)0x162b54;
  ptVar4 = (tcp_conn *)uv_default_loop();
  iVar2 = 0x2e6b38;
  puStack_20 = (uv_pipe_t *)0x162b68;
  iVar1 = uv_pipe_init(ptVar4,&channel,1);
  if (iVar1 == 0) {
    unaff_RBX = &channel;
    iVar2 = 0;
    puStack_20 = (uv_pipe_t *)0x162b81;
    uv_pipe_open(&channel);
    puVar10 = &channel;
    puStack_20 = (uv_pipe_t *)0x162b89;
    iVar1 = uv_is_readable();
    ptVar4 = (tcp_conn *)puVar10;
    if (iVar1 != 1) goto LAB_00162d08;
    puVar10 = &channel;
    puStack_20 = (uv_pipe_t *)0x162b9e;
    iVar1 = uv_is_writable();
    ptVar4 = (tcp_conn *)puVar10;
    if (iVar1 != 1) goto LAB_00162d0d;
    puVar10 = &channel;
    puStack_20 = (uv_pipe_t *)0x162bb3;
    iVar1 = uv_is_closing();
    ptVar4 = (tcp_conn *)puVar10;
    if (iVar1 != 0) goto LAB_00162d12;
    puStack_20 = (uv_pipe_t *)0x162bc0;
    ptVar4 = (tcp_conn *)uv_default_loop();
    iVar2 = 0x2e6c40;
    puStack_20 = (uv_pipe_t *)0x162bcf;
    iVar1 = uv_tcp_init();
    if (iVar1 != 0) goto LAB_00162d17;
    pcVar11 = "0.0.0.0";
    iVar2 = 0x23a3;
    puStack_20 = (uv_pipe_t *)0x162beb;
    iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_18);
    ptVar4 = (tcp_conn *)pcVar11;
    if (iVar1 != 0) goto LAB_00162d1c;
    puVar12 = &tcp_server;
    puStack_20 = (uv_pipe_t *)0x162c04;
    iVar2 = (int)auStack_18;
    iVar1 = uv_tcp_bind(&tcp_server,auStack_18,0);
    ptVar4 = (tcp_conn *)puVar12;
    if (iVar1 != 0) goto LAB_00162d21;
    puVar12 = &tcp_server;
    iVar2 = 0x80;
    puStack_20 = (uv_pipe_t *)0x162c24;
    iVar1 = uv_listen(&tcp_server,0x80,ipc_on_connection_tcp_conn);
    ptVar4 = (tcp_conn *)puVar12;
    if (iVar1 != 0) goto LAB_00162d26;
    puStack_20 = (uv_pipe_t *)0x162c31;
    ptVar4 = (tcp_conn *)uv_default_loop();
    iVar2 = 0x2e6f20;
    puStack_20 = (uv_pipe_t *)0x162c40;
    iVar1 = uv_tcp_init();
    if (iVar1 != 0) goto LAB_00162d2b;
    ptVar4 = (tcp_conn *)0x194b6a;
    iVar2 = 0x23a3;
    puStack_20 = (uv_pipe_t *)0x162c5c;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_18);
    if (iVar1 != 0) goto LAB_00162d30;
    ptVar4 = &conn;
    iVar2 = 0x2e6f20;
    puStack_20 = (uv_pipe_t *)0x162c81;
    iVar1 = uv_tcp_connect(&conn,0x2e6f20,auStack_18,connect_child_process_cb);
    if (iVar1 != 0) goto LAB_00162d35;
    puStack_20 = (uv_pipe_t *)0x162c8e;
    ptVar4 = (tcp_conn *)uv_default_loop();
    iVar2 = 0;
    puStack_20 = (uv_pipe_t *)0x162c98;
    iVar1 = uv_run();
    if (iVar1 != 0) goto LAB_00162d3a;
    if (tcp_conn_read_cb_called != 1) goto LAB_00162d3f;
    if (tcp_conn_write_cb_called != 1) goto LAB_00162d44;
    if (close_cb_called != 4) goto LAB_00162d49;
    puStack_20 = (uv_pipe_t *)0x162ccc;
    unaff_RBX = (uv_pipe_t *)uv_default_loop();
    puStack_20 = (uv_pipe_t *)0x162ce0;
    uv_walk(unaff_RBX,close_walk_cb,0);
    iVar2 = 0;
    puStack_20 = (uv_pipe_t *)0x162cea;
    uv_run(unaff_RBX);
    puStack_20 = (uv_pipe_t *)0x162cef;
    ptVar4 = (tcp_conn *)uv_default_loop();
    puStack_20 = (uv_pipe_t *)0x162cf7;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puStack_20 = (uv_pipe_t *)0x162d08;
    ipc_helper_tcp_connection_cold_1();
LAB_00162d08:
    puStack_20 = (uv_pipe_t *)0x162d0d;
    ipc_helper_tcp_connection_cold_2();
LAB_00162d0d:
    puStack_20 = (uv_pipe_t *)0x162d12;
    ipc_helper_tcp_connection_cold_3();
LAB_00162d12:
    puStack_20 = (uv_pipe_t *)0x162d17;
    ipc_helper_tcp_connection_cold_4();
LAB_00162d17:
    puStack_20 = (uv_pipe_t *)0x162d1c;
    ipc_helper_tcp_connection_cold_5();
LAB_00162d1c:
    puStack_20 = (uv_pipe_t *)0x162d21;
    ipc_helper_tcp_connection_cold_6();
LAB_00162d21:
    puStack_20 = (uv_pipe_t *)0x162d26;
    ipc_helper_tcp_connection_cold_7();
LAB_00162d26:
    puStack_20 = (uv_pipe_t *)0x162d2b;
    ipc_helper_tcp_connection_cold_8();
LAB_00162d2b:
    puStack_20 = (uv_pipe_t *)0x162d30;
    ipc_helper_tcp_connection_cold_9();
LAB_00162d30:
    puStack_20 = (uv_pipe_t *)0x162d35;
    ipc_helper_tcp_connection_cold_10();
LAB_00162d35:
    puStack_20 = (uv_pipe_t *)0x162d3a;
    ipc_helper_tcp_connection_cold_11();
LAB_00162d3a:
    puStack_20 = (uv_pipe_t *)0x162d3f;
    ipc_helper_tcp_connection_cold_12();
LAB_00162d3f:
    puStack_20 = (uv_pipe_t *)0x162d44;
    ipc_helper_tcp_connection_cold_13();
LAB_00162d44:
    puStack_20 = (uv_pipe_t *)0x162d49;
    ipc_helper_tcp_connection_cold_14();
LAB_00162d49:
    puStack_20 = (uv_pipe_t *)0x162d4e;
    ipc_helper_tcp_connection_cold_15();
  }
  puStack_20 = (uv_pipe_t *)ipc_on_connection_tcp_conn;
  ipc_helper_tcp_connection_cold_16();
  puStack_20 = unaff_RBX;
  if (iVar2 == 0) {
    puVar13 = (uv_write_t *)ptVar4;
    if (ptVar4 != (tcp_conn *)&tcp_server) goto LAB_00162e28;
    puVar13 = (uv_write_t *)0xf8;
    puVar5 = (uv_loop_t *)malloc(0xf8);
    if (puVar5 == (uv_loop_t *)0x0) goto LAB_00162e2d;
    puVar9 = puVar5;
    puVar13 = (uv_write_t *)tcp_server.loop;
    iVar1 = uv_tcp_init();
    iVar2 = (int)puVar9;
    if (iVar1 != 0) goto LAB_00162e32;
    puVar12 = &tcp_server;
    puVar9 = puVar5;
    iVar1 = uv_accept();
    iVar2 = (int)puVar9;
    puVar13 = (uv_write_t *)puVar12;
    if (iVar1 != 0) goto LAB_00162e37;
    auStack_30 = uv_buf_init("hello\n",6);
    puVar13 = &conn_notify_req;
    iVar2 = 0x2e6b38;
    iVar1 = uv_write2(&conn_notify_req,&channel,auStack_30,1,puVar5,0);
    if (iVar1 != 0) goto LAB_00162e3c;
    iVar2 = 0x16357c;
    puVar13 = (uv_write_t *)puVar5;
    iVar1 = uv_read_start(puVar5,on_read_alloc,on_tcp_child_process_read);
    if (iVar1 == 0) {
      iVar2 = uv_close(puVar5,close_cb);
      return iVar2;
    }
  }
  else {
    ipc_on_connection_tcp_conn_cold_1();
    puVar13 = (uv_write_t *)ptVar4;
LAB_00162e28:
    ipc_on_connection_tcp_conn_cold_2();
LAB_00162e2d:
    ipc_on_connection_tcp_conn_cold_7();
LAB_00162e32:
    ipc_on_connection_tcp_conn_cold_3();
LAB_00162e37:
    ipc_on_connection_tcp_conn_cold_4();
LAB_00162e3c:
    ipc_on_connection_tcp_conn_cold_5();
  }
  ipc_on_connection_tcp_conn_cold_6();
  if (iVar2 == 0) {
    iVar2 = uv_read_start(((uv_loop_t *)puVar13)->pending_queue[0],on_read_alloc,
                          on_tcp_child_process_read);
    if (iVar2 == 0) {
      return extraout_EAX;
    }
  }
  else {
    connect_child_process_cb_cold_1();
  }
  connect_child_process_cb_cold_2();
  memset(buffer,0x2e,100000);
  large_buf = (uv_buf_t)uv_buf_init(buffer,100000);
  uVar6 = uv_default_loop();
  iVar2 = uv_pipe_init(uVar6,&channel,1);
  if (iVar2 == 0) {
    puVar10 = &channel;
    uv_pipe_open(&channel,0);
    iVar2 = uv_is_readable(&channel);
    if (iVar2 != 1) goto LAB_00162f72;
    iVar2 = uv_is_writable(&channel);
    if (iVar2 != 1) goto LAB_00162f77;
    iVar2 = uv_is_closing(&channel);
    if (iVar2 != 0) goto LAB_00162f7c;
    uVar3 = write_until_data_queued();
    if (uVar3 != 0) {
      send_handle_and_close();
    }
    uVar6 = uv_default_loop();
    iVar2 = uv_run(uVar6,0);
    if (iVar2 != 0) goto LAB_00162f81;
    if (closed_handle_write != '\0') {
      puVar10 = (uv_pipe_t *)uv_default_loop();
      uv_walk(puVar10,close_walk_cb,0);
      uv_run(puVar10,0);
      uVar6 = uv_default_loop();
      iVar2 = uv_loop_close(uVar6);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_00162f8b;
    }
  }
  else {
    ipc_helper_closed_handle_cold_1();
    puVar10 = (uv_pipe_t *)buffer;
LAB_00162f72:
    ipc_helper_closed_handle_cold_2();
LAB_00162f77:
    ipc_helper_closed_handle_cold_3();
LAB_00162f7c:
    ipc_helper_closed_handle_cold_4();
LAB_00162f81:
    ipc_helper_closed_handle_cold_5();
  }
  ipc_helper_closed_handle_cold_6();
LAB_00162f8b:
  ipc_helper_closed_handle_cold_7();
  uVar14 = 0;
  puVar8 = (uv_pipe_t *)write_reqs;
  puStack_68 = puVar10;
  do {
    pcStack_70 = (code *)0x162fce;
    iVar2 = uv_write(puVar8,&channel,&large_buf,1,closed_handle_large_write_cb);
    if (iVar2 != 0) {
      pcStack_70 = send_handle_and_close;
      write_until_data_queued_cold_1();
      puStack_88 = (uv_pipe_t *)0x163009;
      uVar6 = uv_default_loop();
      puStack_88 = (uv_pipe_t *)0x163018;
      iVar2 = uv_tcp_init(uVar6,&tcp_server);
      if (iVar2 == 0) {
        puStack_88 = (uv_pipe_t *)0x163032;
        iVar2 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_78);
        if (iVar2 != 0) goto LAB_00163096;
        puStack_88 = (uv_pipe_t *)0x163049;
        iVar2 = uv_tcp_bind(&tcp_server,auStack_78,0);
        if (iVar2 != 0) goto LAB_0016309b;
        puStack_88 = (uv_pipe_t *)0x16307a;
        iVar2 = uv_write2(&write_req,&channel,&large_buf,1,&tcp_server,closed_handle_write_cb);
        if (iVar2 == 0) {
          puStack_88 = (uv_pipe_t *)0x16308c;
          iVar2 = uv_close(&tcp_server,0);
          return iVar2;
        }
      }
      else {
        puStack_88 = (uv_pipe_t *)0x163096;
        send_handle_and_close_cold_1();
LAB_00163096:
        puStack_88 = (uv_pipe_t *)0x16309b;
        send_handle_and_close_cold_2();
LAB_0016309b:
        puStack_88 = (uv_pipe_t *)0x1630a0;
        send_handle_and_close_cold_3();
      }
      puStack_88 = (uv_pipe_t *)ipc_helper_bind_twice;
      send_handle_and_close_cold_4();
      puStack_b0 = (uv_pipe_t *)0x1630c0;
      puStack_88 = puVar8;
      iVar2 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_98);
      if (iVar2 == 0) {
        puStack_b0 = (uv_pipe_t *)0x1630cd;
        uVar6 = uv_default_loop();
        puStack_b0 = (uv_pipe_t *)0x1630e1;
        iVar2 = uv_pipe_init(uVar6,&channel,1);
        if (iVar2 != 0) goto LAB_0016326a;
        puVar8 = &channel;
        puStack_b0 = (uv_pipe_t *)0x1630fa;
        uv_pipe_open(&channel,0);
        puStack_b0 = (uv_pipe_t *)0x163102;
        iVar2 = uv_is_readable(&channel);
        if (iVar2 != 1) goto LAB_0016326f;
        puStack_b0 = (uv_pipe_t *)0x163117;
        iVar2 = uv_is_writable(&channel);
        if (iVar2 != 1) goto LAB_00163274;
        puStack_b0 = (uv_pipe_t *)0x16312c;
        iVar2 = uv_is_closing(&channel);
        if (iVar2 != 0) goto LAB_00163279;
        puStack_b0 = (uv_pipe_t *)0x163145;
        auStack_a8 = uv_buf_init("hello\n",6);
        puStack_b0 = (uv_pipe_t *)0x163153;
        uVar6 = uv_default_loop();
        puStack_b0 = (uv_pipe_t *)0x163162;
        iVar2 = uv_tcp_init(uVar6,&tcp_server);
        if (iVar2 != 0) goto LAB_0016327e;
        puStack_b0 = (uv_pipe_t *)0x16316f;
        uVar6 = uv_default_loop();
        puStack_b0 = (uv_pipe_t *)0x16317e;
        iVar2 = uv_tcp_init(uVar6,&tcp_server2);
        if (iVar2 != 0) goto LAB_00163283;
        puStack_b0 = (uv_pipe_t *)0x163199;
        iVar2 = uv_tcp_bind(&tcp_server,auStack_98,0);
        if (iVar2 != 0) goto LAB_00163288;
        puStack_b0 = (uv_pipe_t *)0x1631b4;
        iVar2 = uv_tcp_bind(&tcp_server2,auStack_98,0);
        if (iVar2 != 0) goto LAB_0016328d;
        puStack_b0 = (uv_pipe_t *)0x1631e1;
        iVar2 = uv_write2(&write_req,&channel,auStack_a8,1,&tcp_server,0);
        if (iVar2 != 0) goto LAB_00163292;
        puStack_b0 = (uv_pipe_t *)0x16320e;
        iVar2 = uv_write2(&write_req2,&channel,auStack_a8,1,&tcp_server2,0);
        if (iVar2 != 0) goto LAB_00163297;
        puStack_b0 = (uv_pipe_t *)0x16321b;
        uVar6 = uv_default_loop();
        puStack_b0 = (uv_pipe_t *)0x163225;
        iVar2 = uv_run(uVar6,0);
        if (iVar2 != 0) goto LAB_0016329c;
        puStack_b0 = (uv_pipe_t *)0x16322e;
        puVar8 = (uv_pipe_t *)uv_default_loop();
        puStack_b0 = (uv_pipe_t *)0x163242;
        uv_walk(puVar8,close_walk_cb,0);
        puStack_b0 = (uv_pipe_t *)0x16324c;
        uv_run(puVar8,0);
        puStack_b0 = (uv_pipe_t *)0x163251;
        uVar6 = uv_default_loop();
        puStack_b0 = (uv_pipe_t *)0x163259;
        iVar2 = uv_loop_close(uVar6);
        if (iVar2 == 0) {
          return 0;
        }
      }
      else {
        puStack_b0 = (uv_pipe_t *)0x16326a;
        ipc_helper_bind_twice_cold_1();
LAB_0016326a:
        puStack_b0 = (uv_pipe_t *)0x16326f;
        ipc_helper_bind_twice_cold_2();
LAB_0016326f:
        puStack_b0 = (uv_pipe_t *)0x163274;
        ipc_helper_bind_twice_cold_3();
LAB_00163274:
        puStack_b0 = (uv_pipe_t *)0x163279;
        ipc_helper_bind_twice_cold_4();
LAB_00163279:
        puStack_b0 = (uv_pipe_t *)0x16327e;
        ipc_helper_bind_twice_cold_5();
LAB_0016327e:
        puStack_b0 = (uv_pipe_t *)0x163283;
        ipc_helper_bind_twice_cold_6();
LAB_00163283:
        puStack_b0 = (uv_pipe_t *)0x163288;
        ipc_helper_bind_twice_cold_7();
LAB_00163288:
        puStack_b0 = (uv_pipe_t *)0x16328d;
        ipc_helper_bind_twice_cold_8();
LAB_0016328d:
        puStack_b0 = (uv_pipe_t *)0x163292;
        ipc_helper_bind_twice_cold_9();
LAB_00163292:
        puStack_b0 = (uv_pipe_t *)0x163297;
        ipc_helper_bind_twice_cold_10();
LAB_00163297:
        puStack_b0 = (uv_pipe_t *)0x16329c;
        ipc_helper_bind_twice_cold_11();
LAB_0016329c:
        puStack_b0 = (uv_pipe_t *)0x1632a1;
        ipc_helper_bind_twice_cold_12();
      }
      puStack_b0 = (uv_pipe_t *)ipc_helper_send_zero;
      ipc_helper_bind_twice_cold_13();
      puStack_b0 = puVar8;
      auStack_c0 = uv_buf_init(0,0);
      uVar6 = uv_default_loop();
      puVar10 = &channel;
      iVar2 = uv_pipe_init(uVar6,&channel,0);
      if (iVar2 == 0) {
        puVar10 = (uv_pipe_t *)0x0;
        uv_pipe_open(&channel);
        iVar2 = uv_is_readable(&channel);
        if (iVar2 != 1) goto LAB_001633a9;
        iVar2 = uv_is_writable(&channel);
        if (iVar2 != 1) goto LAB_001633ae;
        iVar2 = uv_is_closing(&channel);
        if (iVar2 != 0) goto LAB_001633b3;
        puVar10 = &channel;
        iVar2 = uv_write(&write_req,&channel,auStack_c0,1,send_zero_write_cb);
        if (iVar2 != 0) goto LAB_001633b8;
        uVar6 = uv_default_loop();
        puVar10 = (uv_pipe_t *)0x0;
        iVar2 = uv_run(uVar6);
        if (iVar2 != 0) goto LAB_001633bd;
        if (send_zero_write == 1) {
          uVar6 = uv_default_loop();
          uv_walk(uVar6,close_walk_cb,0);
          puVar10 = (uv_pipe_t *)0x0;
          uv_run(uVar6);
          uVar6 = uv_default_loop();
          iVar2 = uv_loop_close(uVar6);
          if (iVar2 == 0) {
            return 0;
          }
          goto LAB_001633c7;
        }
      }
      else {
        ipc_helper_send_zero_cold_1();
LAB_001633a9:
        ipc_helper_send_zero_cold_2();
LAB_001633ae:
        ipc_helper_send_zero_cold_3();
LAB_001633b3:
        ipc_helper_send_zero_cold_4();
LAB_001633b8:
        ipc_helper_send_zero_cold_5();
LAB_001633bd:
        ipc_helper_send_zero_cold_6();
      }
      ipc_helper_send_zero_cold_7();
LAB_001633c7:
      ipc_helper_send_zero_cold_8();
      if ((int)puVar10 == 0) {
        send_zero_write = send_zero_write + 1;
        return extraout_EAX_00;
      }
      send_zero_write_cb_cold_1();
      pvVar7 = malloc((size_t)puVar10);
      *extraout_RDX = pvVar7;
      extraout_RDX[1] = puVar10;
      return (int)pvVar7;
    }
    if (0x12a < uVar14) break;
    uVar14 = uVar14 + 1;
    puVar8 = (uv_pipe_t *)puVar8->write_queue;
  } while (channel.write_queue_size == 0);
  return (int)channel.write_queue_size;
}

Assistant:

int ipc_helper_tcp_connection(void) {
  /*
   * This is launched from test-ipc.c. stdin is a duplex channel
   * over which a handle will be transmitted.
   */

  int r;
  struct sockaddr_in addr;

  r = uv_pipe_init(uv_default_loop(), &channel, 1);
  ASSERT(r == 0);

  uv_pipe_open(&channel, 0);

  ASSERT(1 == uv_is_readable((uv_stream_t*) &channel));
  ASSERT(1 == uv_is_writable((uv_stream_t*) &channel));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &channel));

  r = uv_tcp_init(uv_default_loop(), &tcp_server);
  ASSERT(r == 0);

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_tcp_bind(&tcp_server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_listen((uv_stream_t*)&tcp_server, BACKLOG, ipc_on_connection_tcp_conn);
  ASSERT(r == 0);

  /* Make a connection to the server */
  r = uv_tcp_init(uv_default_loop(), &conn.conn);
  ASSERT(r == 0);

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_tcp_connect(&conn.conn_req,
                     (uv_tcp_t*) &conn.conn,
                     (const struct sockaddr*) &addr,
                     connect_child_process_cb);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(tcp_conn_read_cb_called == 1);
  ASSERT(tcp_conn_write_cb_called == 1);
  ASSERT(close_cb_called == 4);

  MAKE_VALGRIND_HAPPY();
  return 0;
}